

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.cpp
# Opt level: O1

void idx2::AbortHandler(int Signum)

{
  bool bVar1;
  char *pcVar2;
  printer Pr;
  printer pStack_28;
  
  bVar1 = true;
  pcVar2 = (char *)0x0;
  switch(Signum) {
  case 4:
    pcVar2 = "SIGILL";
    break;
  default:
    goto switchD_0010ae27_caseD_5;
  case 6:
    pcVar2 = "SIGABRT";
    break;
  case 7:
    pcVar2 = "SIGBUS";
    break;
  case 8:
    pcVar2 = "SIGFPE";
    break;
  case 0xb:
    pcVar2 = "SIGSEGV";
  }
  bVar1 = false;
switchD_0010ae27_caseD_5:
  if (bVar1) {
    fprintf(_stderr,"Caught signal %d\n",Signum,pcVar2);
  }
  else {
    fprintf(_stderr,"Caught signal %d (%s)\n",Signum,pcVar2);
  }
  printer::printer(&pStack_28,(FILE *)_stderr);
  PrintStacktrace(&pStack_28);
  exit(Signum);
}

Assistant:

void
AbortHandler(int Signum)
{
  cstr Name = nullptr;
  switch (Signum)
  {
    case SIGABRT:
      Name = "SIGABRT";
      break;
    case SIGSEGV:
      Name = "SIGSEGV";
      break;
#if !defined(_WIN32)
    case SIGBUS:
      Name = "SIGBUS";
      break;
#endif
    case SIGILL:
      Name = "SIGILL";
      break;
    case SIGFPE:
      Name = "SIGFPE";
      break;
  };
  if (Name)
    fprintf(stderr, "Caught signal %d (%s)\n", Signum, Name);
  else
    fprintf(stderr, "Caught signal %d\n", Signum);

  printer Pr(stderr);
  PrintStacktrace(&Pr);
  exit(Signum);
}